

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O2

Matrix2f __thiscall Matrix2f::inverse(Matrix2f *this,bool *pbIsSingular,float epsilon)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 *in_RDX;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  float fVar9;
  Matrix2f MVar10;
  
  fVar9 = *(float *)(pbIsSingular + 4);
  uVar1 = *(uint *)pbIsSingular;
  uVar8 = (ulong)uVar1;
  uVar2 = *(uint *)(pbIsSingular + 0xc);
  auVar3 = vfmsub231ss_fma(ZEXT416((uint)(fVar9 * *(float *)(pbIsSingular + 8))),ZEXT416(uVar1),
                           ZEXT416(uVar2));
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx512vl(auVar3,auVar5);
  if (epsilon <= auVar5._0_4_) {
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar5 = vxorps_avx512vl(ZEXT416((uint)*(float *)(pbIsSingular + 8)),auVar6);
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 0;
    }
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(ZEXT416((uint)fVar9),auVar4);
    fVar9 = 1.0 / auVar3._0_4_;
    auVar3 = vunpcklps_avx(ZEXT416(uVar2),auVar6);
    auVar3 = vinsertps_avx(auVar3,auVar5,0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x30);
    auVar7._0_8_ = CONCAT44(fVar9 * auVar3._4_4_,fVar9 * auVar3._0_4_);
    auVar7._8_4_ = fVar9 * auVar3._8_4_;
    auVar7._12_4_ = fVar9 * auVar3._12_4_;
    *(undefined1 (*) [16])this->m_elements = auVar7;
  }
  else {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 1;
    }
    auVar7._0_8_ = 0;
    uVar8 = (ulong)uVar1;
    Matrix2f(this,0.0);
  }
  MVar10.m_elements[2] = (float)(int)uVar8;
  MVar10.m_elements[3] = (float)(int)(uVar8 >> 0x20);
  MVar10.m_elements[0] = (float)(int)auVar7._0_8_;
  MVar10.m_elements[1] = (float)(int)((ulong)auVar7._0_8_ >> 0x20);
  return (Matrix2f)MVar10.m_elements;
}

Assistant:

Matrix2f Matrix2f::inverse( bool* pbIsSingular, float epsilon )
{
	float determinant = m_elements[ 0 ] * m_elements[ 3 ] - m_elements[ 2 ] * m_elements[ 1 ];

	bool isSingular = ( fabs( determinant ) < epsilon );
	if( isSingular )
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = true;
		}
		return Matrix2f();
	}
	else
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = false;
		}

		float reciprocalDeterminant = 1.0f / determinant;

		return Matrix2f
		(
			m_elements[ 3 ] * reciprocalDeterminant, -m_elements[ 2 ] * reciprocalDeterminant,
			-m_elements[ 1 ] * reciprocalDeterminant, m_elements[ 0 ] * reciprocalDeterminant
		);
	}
}